

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

char * SpellcheckString(char *text,...)

{
  char in_AL;
  long *plVar1;
  char *pcVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char *word;
  vector<const_char_*,_std::allocator<const_char_*>_> words;
  allocator<char> local_129;
  ulong local_128;
  long *local_120;
  undefined1 *local_118;
  value_type local_110;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_108;
  string local_e8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_118 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_120 = (long *)&stack0x00000008;
  local_128 = 0x3000000008;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar3 = local_128 & 0xffffffff;
    if (uVar3 < 0x29) {
      local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
      plVar1 = (long *)(local_118 + uVar3);
    }
    else {
      plVar1 = local_120;
      local_120 = local_120 + 1;
    }
    local_110 = (value_type)*plVar1;
    if (local_110 == (value_type)0x0) break;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_108,&local_110);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,text,&local_129);
  pcVar2 = SpellcheckStringV(&local_e8,
                             (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_108);
  return pcVar2;
}

Assistant:

const char* SpellcheckString(const char* text, ...) {
  // Note: This takes a const char* instead of a string& because using
  // va_start() with a reference parameter is undefined behavior.
  va_list ap;
  va_start(ap, text);
  vector<const char*> words;
  const char* word;
  while ((word = va_arg(ap, const char*)))
    words.push_back(word);
  va_end(ap);
  return SpellcheckStringV(text, words);
}